

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<QString,_QMakeLocalFileName>_>::freeData
          (Span<QHashPrivate::Node<QString,_QMakeLocalFileName>_> *this)

{
  byte bVar1;
  char16_t *pcVar2;
  Node<QString,_QMakeLocalFileName> *pNVar3;
  Node<QString,_QMakeLocalFileName> *in_RDI;
  uchar o;
  uchar *__end4;
  uchar *__begin4;
  uchar (*__range4) [128];
  Node<QString,_QMakeLocalFileName> *local_18;
  
  if (in_RDI[1].value.local_name.d.ptr != (char16_t *)0x0) {
    pNVar3 = in_RDI + 1;
    for (local_18 = in_RDI;
        local_18 != (Node<QString,_QMakeLocalFileName> *)&(pNVar3->value).local_name.d.ptr;
        local_18 = (Node<QString,_QMakeLocalFileName> *)((long)&(local_18->key).d.d + 1)) {
      bVar1 = *(byte *)&(local_18->key).d.d;
      if (bVar1 != 0xff) {
        Entry::node((Entry *)(in_RDI[1].value.local_name.d.ptr + (ulong)bVar1 * 0x24));
        Node<QString,_QMakeLocalFileName>::~Node(in_RDI);
      }
    }
    pcVar2 = in_RDI[1].value.local_name.d.ptr;
    if (pcVar2 != (char16_t *)0x0) {
      operator_delete__(pcVar2);
    }
    in_RDI[1].value.local_name.d.ptr = (char16_t *)0x0;
  }
  return;
}

Assistant:

void freeData() noexcept(std::is_nothrow_destructible<Node>::value)
    {
        if (entries) {
            if constexpr (!std::is_trivially_destructible<Node>::value) {
                for (auto o : offsets) {
                    if (o != SpanConstants::UnusedEntry)
                        entries[o].node().~Node();
                }
            }
            delete[] entries;
            entries = nullptr;
        }
    }